

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.c
# Opt level: O0

void gc_acc_twist_accumulate(gc_acc_twist *xdd1,gc_acc_twist *xdd2,gc_acc_twist *r)

{
  gc_acc_twist *r_local;
  gc_acc_twist *xdd2_local;
  gc_acc_twist *xdd1_local;
  
  if (xdd1 == (gc_acc_twist *)0x0) {
    __assert_fail("xdd1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                  ,400,
                  "void gc_acc_twist_accumulate(const struct gc_acc_twist *, const struct gc_acc_twist *, struct gc_acc_twist *)"
                 );
  }
  if (xdd2 != (gc_acc_twist *)0x0) {
    if (r != (gc_acc_twist *)0x0) {
      la_daxpy_oe(3,1.0,(double *)xdd1->angular_acceleration,1,(double *)xdd2->angular_acceleration,
                  1,(double *)r->angular_acceleration,1);
      la_daxpy_oe(3,1.0,(double *)xdd1->linear_acceleration,1,(double *)xdd2->linear_acceleration,1,
                  (double *)r->linear_acceleration,1);
      return;
    }
    __assert_fail("r",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                  ,0x192,
                  "void gc_acc_twist_accumulate(const struct gc_acc_twist *, const struct gc_acc_twist *, struct gc_acc_twist *)"
                 );
  }
  __assert_fail("xdd2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                ,0x191,
                "void gc_acc_twist_accumulate(const struct gc_acc_twist *, const struct gc_acc_twist *, struct gc_acc_twist *)"
               );
}

Assistant:

void gc_acc_twist_accumulate(
        const struct gc_acc_twist *xdd1,
        const struct gc_acc_twist *xdd2,
        struct gc_acc_twist *r)
{
    assert(xdd1);
    assert(xdd2);
    assert(r);

    la_daxpy_oe(3,
            1.0, (double *)xdd1->angular_acceleration, 1,
            (double *)xdd2->angular_acceleration, 1,
            (double *)r->angular_acceleration, 1);

    la_daxpy_oe(3,
            1.0, (double *)xdd1->linear_acceleration, 1,
            (double *)xdd2->linear_acceleration, 1,
            (double *)r->linear_acceleration, 1);
}